

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTImgWindow.cpp
# Opt level: O1

void ImGui::Indicator(bool bOK,char *okText,char *nokText)

{
  int iVar1;
  bool bVar2;
  char *text;
  ImVec2 IVar3;
  ImVec2 IVar4;
  
  IVar3 = GetContentRegionMax();
  if ((NAN(gWidthIconBtn)) ||
     (iVar1 = GetWidthIconBtn::cacheCnt + -1, bVar2 = GetWidthIconBtn::cacheCnt < 1,
     GetWidthIconBtn::cacheCnt = iVar1, bVar2)) {
    IVar4 = CalcTextSize(anon_var_dwarf_264125,(char *)0x0,false,-1.0);
    gWidthIconBtn = IVar4.x;
    GetWidthIconBtn::cacheCnt = 100;
  }
  SetCursorPosX(IVar3.x - gWidthIconBtn);
  text = anon_var_dwarf_2685f1;
  if (bOK) {
    text = anon_var_dwarf_2685e6;
  }
  TextUnformatted(text,(char *)0x0);
  bVar2 = IsItemHovered(0);
  if (bVar2) {
    if (bOK) {
      nokText = okText;
    }
    SetTooltip("%s",nokText);
    return;
  }
  return;
}

Assistant:

IMGUI_API void Indicator (bool bOK, const char* okText, const char* nokText)
{
    // right-aligned
    ImGui::SetCursorPosX(ImGui::GetContentRegionMax().x - ImGui::GetWidthIconBtn());
    // for the active line decide based on temporary check
    ImGui::TextUnformatted(bOK ? ICON_FA_CHECK_CIRCLE : ICON_FA_EXCLAMATION_TRIANGLE);
    if (ImGui::IsItemHovered())
        ImGui::SetTooltip("%s", bOK ? okText : nokText);
}